

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall
OSSLEVPSymmetricAlgorithm::decryptFinal(OSSLEVPSymmetricAlgorithm *this,ByteString *data)

{
  EVP_CIPHER_CTX *pEVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uchar *puVar6;
  uchar *in;
  ulong uVar7;
  char *pcVar8;
  OSSLEVPSymmetricAlgorithm *this_00;
  long *in_RDI;
  int rv;
  int outLen;
  int initialSize;
  int outLen_1;
  ByteString aeadBuffer;
  size_t tagBytes;
  Type mode;
  ByteString *in_stack_fffffffffffffe88;
  OSSLEVPSymmetricAlgorithm *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  ByteString *in_stack_fffffffffffffea0;
  int local_6c;
  int local_68;
  int local_64 [15];
  ulong local_28;
  int local_1c;
  byte local_1;
  
  local_1c = (int)in_RDI[2];
  local_28 = in_RDI[4];
  ByteString::ByteString
            (in_stack_fffffffffffffea0,
             (ByteString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  bVar2 = SymmetricAlgorithm::decryptFinal
                    ((SymmetricAlgorithm *)
                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (ByteString *)in_stack_fffffffffffffe90);
  if (!bVar2) {
    clean(in_stack_fffffffffffffe90);
    local_1 = 0;
    goto LAB_001bc7ec;
  }
  ByteString::resize((ByteString *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
  if (local_1c == 5) {
    sVar5 = ByteString::size((ByteString *)0x1bc324);
    uVar7 = local_28;
    if (sVar5 < local_28) {
      sVar5 = ByteString::size((ByteString *)0x1bc361);
      softHSMLog(3,"decryptFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x1dd,"Tag bytes (%d) does not fit in AEAD buffer (%d)",uVar7,sVar5);
      clean(in_stack_fffffffffffffe90);
      local_1 = 0;
      goto LAB_001bc7ec;
    }
    pEVar1 = (EVP_CIPHER_CTX *)in_RDI[0xc];
    iVar3 = (int)local_28;
    ByteString::size((ByteString *)0x1bc3ff);
    puVar6 = ByteString::operator[]
                       ((ByteString *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    EVP_CIPHER_CTX_ctrl(pEVar1,0x11,iVar3,puVar6);
    ByteString::size((ByteString *)0x1bc473);
    (**(code **)(*in_RDI + 0x68))();
    ByteString::resize((ByteString *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    sVar5 = ByteString::size((ByteString *)0x1bc4e2);
    local_64[0] = (int)sVar5;
    pEVar1 = (EVP_CIPHER_CTX *)in_RDI[0xc];
    puVar6 = ByteString::operator[]
                       ((ByteString *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    in = ByteString::const_byte_str(in_stack_fffffffffffffe88);
    sVar5 = ByteString::size((ByteString *)0x1bc54e);
    iVar3 = EVP_DecryptUpdate(pEVar1,puVar6,local_64,in,(int)sVar5 - (int)local_28);
    if (iVar3 == 0) {
      uVar7 = ERR_get_error();
      pcVar8 = ERR_error_string(uVar7,(char *)0x0);
      softHSMLog(3,"decryptFinal",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
                 ,0x1ed,"EVP_DecryptUpdate failed: %s",pcVar8);
      clean(in_stack_fffffffffffffe90);
      local_1 = 0;
      goto LAB_001bc7ec;
    }
    ByteString::resize((ByteString *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
  }
  sVar5 = ByteString::size((ByteString *)0x1bc636);
  local_68 = (int)sVar5;
  (**(code **)(*in_RDI + 0x68))();
  ByteString::resize((ByteString *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
  sVar5 = ByteString::size((ByteString *)0x1bc6a1);
  local_6c = (int)sVar5 - local_68;
  pEVar1 = (EVP_CIPHER_CTX *)in_RDI[0xc];
  puVar6 = ByteString::operator[]
                     ((ByteString *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
  uVar4 = EVP_DecryptFinal(pEVar1,puVar6,&local_6c);
  if (uVar4 == 0) {
    uVar7 = ERR_get_error();
    this_00 = (OSSLEVPSymmetricAlgorithm *)ERR_error_string(uVar7,(char *)0x0);
    softHSMLog(3,"decryptFinal",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPSymmetricAlgorithm.cpp"
               ,0x200,"EVP_DecryptFinal failed (0x%08X): %s",(ulong)uVar4,this_00);
    clean(this_00);
    local_1 = 0;
  }
  else {
    ByteString::resize((ByteString *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    clean(in_stack_fffffffffffffe90);
    local_1 = 1;
  }
LAB_001bc7ec:
  local_64[1] = 1;
  ByteString::~ByteString((ByteString *)0x1bc7f9);
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPSymmetricAlgorithm::decryptFinal(ByteString& data)
{
	SymMode::Type mode = currentCipherMode;
	size_t tagBytes = currentTagBytes;
	ByteString aeadBuffer = currentAEADBuffer;

	if (!SymmetricAlgorithm::decryptFinal(data))
	{
		clean();
		return false;
	}

	data.resize(0);
	if (mode == SymMode::GCM)
	{
		// Check buffer size
		if (aeadBuffer.size() < tagBytes)
		{
			ERROR_MSG("Tag bytes (%d) does not fit in AEAD buffer (%d)", tagBytes, aeadBuffer.size());

			clean();

			return false;
		}

		// Set the tag
		EVP_CIPHER_CTX_ctrl(pCurCTX, EVP_CTRL_GCM_SET_TAG, tagBytes, &aeadBuffer[aeadBuffer.size()-tagBytes]);

		// Prepare the output block
		data.resize(aeadBuffer.size() - tagBytes + getBlockSize());
		int outLen = data.size();

		if (!EVP_DecryptUpdate(pCurCTX, &data[0], &outLen, (unsigned char*) aeadBuffer.const_byte_str(), aeadBuffer.size() - tagBytes))
		{
			ERROR_MSG("EVP_DecryptUpdate failed: %s", ERR_error_string(ERR_get_error(), NULL));

			clean();

			return false;
		}

		data.resize(outLen);
	}

	// Prepare the output block
	int initialSize = data.size();
	data.resize(initialSize + getBlockSize());

	int outLen = data.size() - initialSize;
	int rv = EVP_DecryptFinal(pCurCTX, &data[initialSize], &outLen);

	if (!rv)
	{
		ERROR_MSG("EVP_DecryptFinal failed (0x%08X): %s", rv, ERR_error_string(ERR_get_error(), NULL));

		clean();

		return false;
	}

	// Resize the output block
	data.resize(initialSize + outLen);

	clean();

	return true;
}